

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout> *
__thiscall
dlib::matrix<long,0l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>::
operator=(matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          *this,matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_> *m)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *pmVar4;
  matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_> *src;
  layout<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_3> *in_RDI;
  matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout> temp;
  matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_>
  *in_stack_ffffffffffffff98;
  matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_>
  *in_stack_ffffffffffffffa0;
  long in_stack_ffffffffffffffa8;
  matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *in_stack_ffffffffffffffb0;
  
  bVar1 = matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>>>>::
          destructively_aliases<dlib::matrix<long,0l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
                    (in_stack_ffffffffffffffa0,
                     (matrix_exp<dlib::matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
                      *)in_stack_ffffffffffffff98);
  if (bVar1) {
    matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
    matrix((matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
            *)in_stack_ffffffffffffffa0);
    pmVar4 = (matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
              *)matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_>::nr
                          ((matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_>
                            *)0x295c60);
    src = (matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_> *)
          matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_>::nc
                    ((matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_> *
                     )0x295c71);
    matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
    set_size(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(long)pmVar4);
    matrix_assign<dlib::matrix<long,0l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>>>>
              (pmVar4,src);
    matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
    swap(pmVar4,(matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                 *)src);
    matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
    ~matrix((matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
             *)0x295cb8);
  }
  else {
    lVar2 = row_major_layout::layout<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_3>
            ::nr(in_RDI);
    lVar3 = matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_>::nr
                      ((matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_>
                        *)0x295bc9);
    if (lVar2 == lVar3) {
      in_stack_ffffffffffffffb0 =
           (matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
            *)row_major_layout::
              layout<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_3>::nc(in_RDI);
      pmVar4 = (matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *)matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_>::nc
                            ((matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_>
                              *)0x295bef);
      if (in_stack_ffffffffffffffb0 == pmVar4) {
        matrix_assign<dlib::matrix<long,0l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>>>>
                  ((matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                    *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        return (matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *)in_RDI;
      }
    }
    lVar2 = matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_>::nr
                      ((matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_>
                        *)0x295c17);
    matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_>::nc
              ((matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_> *)
               0x295c26);
    matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
    set_size(in_stack_ffffffffffffffb0,lVar2,(long)in_stack_ffffffffffffffa0);
    matrix_assign<dlib::matrix<long,0l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>>>>
              ((matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return (matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          *)in_RDI;
}

Assistant:

matrix& operator= (
            const matrix_exp<EXP>& m
        )
        {
            // You get an error on this line if the matrix you are trying to 
            // assign m to is a statically sized matrix and  m's dimensions don't 
            // match that of *this. 
            COMPILE_TIME_ASSERT(EXP::NR == NR || NR == 0 || EXP::NR == 0);
            COMPILE_TIME_ASSERT(EXP::NC == NC || NC == 0 || EXP::NC == 0);
            DLIB_ASSERT((NR == 0 || nr() == m.nr()) && 
                   (NC == 0 || nc() == m.nc()), 
                "\tmatrix& matrix::operator=(const matrix_exp& m)"
                << "\n\tYou are trying to assign a dynamically sized matrix to a statically sized matrix with the wrong size"
                << "\n\tnr():   " << nr()
                << "\n\tnc():   " << nc()
                << "\n\tm.nr(): " << m.nr()
                << "\n\tm.nc(): " << m.nc()
                << "\n\tthis:   " << this
                );

            // You get an error on this line if the matrix m contains a type that isn't
            // the same as the type contained in the target matrix.
            COMPILE_TIME_ASSERT((is_same_type<typename EXP::type,type>::value == true) ||
                                (is_matrix<typename EXP::type>::value == true));
            if (m.destructively_aliases(*this) == false)
            {
                // This if statement is seemingly unnecessary since set_size() contains this
                // exact same if statement.  However, structuring the code this way causes
                // gcc to handle the way it inlines this function in a much more favorable way.
                if (data.nr() == m.nr() && data.nc() == m.nc())
                {
                    matrix_assign(*this, m);
                }
                else
                {
                    set_size(m.nr(),m.nc());
                    matrix_assign(*this, m);
                }
            }
            else
            {
                // we have to use a temporary matrix object here because
                // *this is aliased inside the matrix_exp m somewhere.
                matrix temp;
                temp.set_size(m.nr(),m.nc());
                matrix_assign(temp, m);
                temp.swap(*this);
            }
            return *this;
        }